

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

Amount __thiscall cfd::core::ConfidentialValue::GetAmount(ConfidentialValue *this)

{
  int64_t iVar1;
  undefined4 uVar2;
  Amount AVar3;
  void *local_30 [3];
  
  AVar3 = Amount::CreateBySatoshiAmount(0);
  iVar1 = AVar3.amount_;
  if (this->version_ == '\x01') {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
               &(this->data_).data_);
    AVar3 = ConvertFromConfidentialValue((ByteData *)local_30);
    iVar1 = AVar3.amount_;
    uVar2 = AVar3._8_4_;
    if (local_30[0] != (void *)0x0) {
      operator_delete(local_30[0]);
    }
  }
  else {
    uVar2 = AVar3._8_4_;
  }
  AVar3._8_4_ = uVar2;
  AVar3.amount_ = iVar1;
  AVar3._12_4_ = 0;
  return AVar3;
}

Assistant:

Amount ConfidentialValue::GetAmount() const {
  Amount amount = Amount::CreateBySatoshiAmount(0);
  if (version_ == 1) {
    amount = ConvertFromConfidentialValue(GetData());
  }
  return amount;
}